

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void key(GLFWwindow *window,int k,int scancode,int action,int mods)

{
  Tetromino *pTVar1;
  string *psVar2;
  ostream *this;
  int mods_local;
  int action_local;
  int scancode_local;
  int k_local;
  GLFWwindow *window_local;
  
  if ((action == 1) || (action == 2)) {
    if (k == 0x20) {
      if (state == MENU) {
        state = PLAYING;
      }
      else if (state == PLAYING) {
        state = PAUSED;
      }
      else if (state == PAUSED) {
        state = PLAYING;
      }
    }
    else if (k == 0x2d) {
      World::decreaseSpeed(world);
    }
    else if (k == 0x31) {
      World::resetTet(world,'I');
    }
    else if (k == 0x32) {
      World::resetTet(world,'O');
    }
    else if (k == 0x33) {
      World::resetTet(world,'T');
    }
    else if (k == 0x34) {
      World::resetTet(world,'J');
    }
    else if (k == 0x35) {
      World::resetTet(world,'L');
    }
    else if (k == 0x36) {
      World::resetTet(world,'S');
    }
    else if (k == 0x37) {
      World::resetTet(world,'Z');
    }
    else if (k == 0x38) {
      World::resetTet(world,'D');
    }
    else if (k == 0x3d) {
      World::increaseSpeed(world);
    }
    else if (k == 0x41) {
      World::rotateLeft(world);
    }
    else if (k == 0x45) {
      World::setMode(world,INFINITY_MODE);
      World::start(world);
    }
    else if (k == 0x50) {
      pTVar1 = World::getActiveTet(world);
      psVar2 = (string *)(**(code **)(*(long *)&pTVar1->super_Entity + 0x40))();
      this = std::operator<<((ostream *)&std::cout,psVar2);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    else if (k == 0x51) {
      World::setMode(world,REGULAR_MODE);
      World::start(world);
    }
    else if (k == 0x52) {
      World::resetTet(world,(TetrominoType *)0x0);
    }
    else if (k == 0x53) {
      World::rotateRight(world);
    }
    else if (k == 0x57) {
      World::setMode(world,FROZEN_MODE);
      World::start(world);
    }
    else if (k != 0x100) {
      if (k == 0x106) {
        World::moveRight(world);
      }
      else if (k == 0x107) {
        World::moveLeft(world);
      }
      else if (k == 0x108) {
        World::moveDown(world);
      }
      else if (k == 0x109) {
        World::moveUp(world);
      }
    }
  }
  return;
}

Assistant:

void key(GLFWwindow* window, int k, int scancode, int action, int mods) {
    if (action == GLFW_PRESS || action == GLFW_REPEAT) {
        switch (k) {
            case GLFW_KEY_1:
                world->resetTet('I');
                break;
            case GLFW_KEY_2:
                world->resetTet('O');
                break;
            case GLFW_KEY_3:
                world->resetTet('T');
                break;
            case GLFW_KEY_4:
                world->resetTet('J');
                break;
            case GLFW_KEY_5:
                world->resetTet('L');
                break;
            case GLFW_KEY_6:
                world->resetTet('S');
                break;
            case GLFW_KEY_7:
                world->resetTet('Z');
                break;
            case GLFW_KEY_8:
                world->resetTet('D');
                break;
            case GLFW_KEY_Q:
                world->setMode(World::PlayMode::REGULAR_MODE);
                world->start();
                break;
            case GLFW_KEY_W:
                world->setMode(World::PlayMode::FROZEN_MODE);
                world->start();
                break;
            case GLFW_KEY_E:
                world->setMode(World::PlayMode::INFINITY_MODE);
                world->start();
                break;
            case GLFW_KEY_P:
                cout << *world->getActiveTet()->toString() << endl;
                break;
            case GLFW_KEY_A:
                world->rotateLeft();
                break;
            case GLFW_KEY_S:
                world->rotateRight();
                break;
            case GLFW_KEY_R:
                world->resetTet(nullptr);
                break;
            case GLFW_KEY_LEFT:
                world->moveLeft();
                break;
            case GLFW_KEY_RIGHT:
                world->moveRight();
                break;
            case GLFW_KEY_UP:
                world->moveUp();
                break;
            case GLFW_KEY_DOWN:
                world->moveDown();
                break;
            case GLFW_KEY_SPACE:
                if (state == MENU) {
                    state = PLAYING;
                } else if (state == PLAYING) {
                    state = PAUSED;
                } else if (state == PAUSED) {
                    state = PLAYING;
                }
                break;
            case GLFW_KEY_EQUAL:
                world->increaseSpeed();
                break;
            case GLFW_KEY_MINUS:
                world->decreaseSpeed();
                break;
            case GLFW_KEY_ESCAPE:
                break;
            default:
                return;
        }
    }
}